

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_draw.c
# Opt level: O0

void blur(guint8 *buf,int w,int h)

{
  byte bVar1;
  byte bVar2;
  uint nsum;
  uint osum;
  int y;
  int x;
  int h_local;
  int w_local;
  guint8 *buf_local;
  
  for (y = 0; y < h; y = y + 1) {
    osum = (uint)buf[y * w] << 1;
    for (x = 0; x < w + -1; x = x + 1) {
      bVar1 = buf[y * w + x];
      bVar2 = buf[y * w + x + 1];
      buf[y * w + x] = (guint8)(osum + (uint)bVar1 + (uint)bVar2 >> 2);
      osum = (uint)bVar1 + (uint)bVar2;
    }
  }
  for (x = 0; x < w; x = x + 1) {
    osum = (uint)buf[x] << 1;
    for (y = 0; y < h + -1; y = y + 1) {
      bVar1 = buf[y * w + x];
      bVar2 = buf[(y + 1) * w + x];
      buf[y * w + x] = (guint8)(osum + (uint)bVar1 + (uint)bVar2 >> 2);
      osum = (uint)bVar1 + (uint)bVar2;
    }
  }
  return;
}

Assistant:

static void blur(guint8 *buf, int w, int h) {
    int x, y;
    unsigned int osum, nsum;

    for (y = 0; y < h; ++y) {
        osum = 2 * buf[y * w];
        for (x = 0; x < w - 1; ++x) {
            nsum = buf[y * w + x] + buf[y * w + x + 1];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }

    for (x = 0; x < w; ++x) {
        osum = 2 * buf[x];
        for (y = 0; y < h - 1; ++y) {
            nsum = buf[y * w + x] + buf[(y + 1) * w + x];
            buf[y * w + x] = (osum + nsum) >> 2;
            osum = nsum;
        }
    }
}